

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O1

double __thiscall chrono::fea::ChElementShellANCF_3833::GetDensity(ChElementShellANCF_3833 *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  pointer pLVar3;
  ulong *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (this->m_numLayers < 1) {
    dVar7 = 0.0;
  }
  else {
    auVar8 = ZEXT816(0);
    lVar6 = 0;
    lVar5 = 0;
    do {
      pLVar3 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = *(ulong **)
                ((long)&(pLVar3->m_material).
                        super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + lVar6);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(pLVar3->m_material).
                         super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount + lVar6);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      uVar1 = *puVar4;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        auVar8._8_8_ = 0;
      }
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)((long)&((this->m_layers).
                                        super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_thickness +
                               lVar6);
      auVar8 = vfmadd231sd_fma(auVar8,auVar9,auVar2);
      dVar7 = auVar8._0_8_;
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (lVar5 < this->m_numLayers);
  }
  return dVar7 / this->m_thicknessZ;
}

Assistant:

double ChElementShellANCF_3833::GetDensity() {
    double tot_density = 0;
    for (int kl = 0; kl < m_numLayers; kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();
        double layerthick = m_layers[kl].Get_thickness();
        tot_density += rho * layerthick;
    }
    return tot_density / m_thicknessZ;
}